

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::testCaseEnded(JunitReporter *this,TestCaseStats *testCaseStats)

{
  TestCaseStats *testCaseStats_local;
  JunitReporter *this_local;
  
  std::__cxx11::string::operator+=((string *)&this->stdOutForSuite,(string *)&testCaseStats->stdOut)
  ;
  std::__cxx11::string::operator+=((string *)&this->stdErrForSuite,(string *)&testCaseStats->stdErr)
  ;
  CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>,testCaseStats);
  return;
}

Assistant:

void JunitReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        stdOutForSuite += testCaseStats.stdOut;
        stdErrForSuite += testCaseStats.stdErr;
        CumulativeReporterBase::testCaseEnded( testCaseStats );
    }